

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc.cpp
# Opt level: O0

bool __thiscall
flatbuffers::FlatCompiler::RegisterCodeGenerator
          (FlatCompiler *this,FlatCOption *option,
          shared_ptr<flatbuffers::CodeGenerator> *code_generator)

{
  uint uVar1;
  ulong uVar2;
  mapped_type *pmVar3;
  bool local_181;
  bool local_139;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  _Self local_e8;
  byte local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  _Self local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  _Self local_70 [3];
  byte local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  _Self local_30;
  shared_ptr<flatbuffers::CodeGenerator> *local_28;
  shared_ptr<flatbuffers::CodeGenerator> *code_generator_local;
  FlatCOption *option_local;
  FlatCompiler *this_local;
  
  local_28 = code_generator;
  code_generator_local = (shared_ptr<flatbuffers::CodeGenerator> *)option;
  option_local = (FlatCOption *)this;
  uVar1 = std::__cxx11::string::empty();
  local_51 = 0;
  local_139 = false;
  if ((uVar1 & 1) == 0) {
    std::operator+(&local_50,"-",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   code_generator_local);
    local_51 = 1;
    local_30._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>_>_>
         ::find(&this->code_generators_,&local_50);
    local_70[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>_>_>
         ::end(&this->code_generators_);
    local_139 = std::operator!=(&local_30,local_70);
  }
  if ((local_51 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_50);
  }
  if (local_139 == false) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::operator+(&local_b0,"-",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     code_generator_local);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>_>_>
               ::operator[](&this->code_generators_,&local_b0);
      std::shared_ptr<flatbuffers::CodeGenerator>::operator=(pmVar3,code_generator);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    uVar1 = std::__cxx11::string::empty();
    local_d9 = 0;
    local_181 = false;
    if ((uVar1 & 1) == 0) {
      std::operator+(&local_d8,"--",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (code_generator_local + 2));
      local_d9 = 1;
      local_b8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>_>_>
           ::find(&this->code_generators_,&local_d8);
      local_e8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>_>_>
           ::end(&this->code_generators_);
      local_181 = std::operator!=(&local_b8,&local_e8);
    }
    if ((local_d9 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_d8);
    }
    if (local_181 == false) {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        std::operator+(&local_128,"--",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (code_generator_local + 2));
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>_>_>
                 ::operator[](&this->code_generators_,&local_128);
        std::shared_ptr<flatbuffers::CodeGenerator>::operator=(pmVar3,code_generator);
        std::__cxx11::string::~string((string *)&local_128);
      }
      std::
      set<flatbuffers::FlatCOption,_flatbuffers::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/flatc.cpp:275:12),_std::allocator<flatbuffers::FlatCOption>_>
      ::insert((set<flatbuffers::FlatCOption,_flatbuffers::(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_aardappel[P]flatbuffers_src_flatc_cpp:275:12),_std::allocator<flatbuffers::FlatCOption>_>
                *)language_options,(value_type *)code_generator_local);
      this_local._7_1_ = true;
    }
    else {
      std::operator+(&local_108,"multiple generators registered under: --",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (code_generator_local + 2));
      Error(this,&local_108,false,false);
      std::__cxx11::string::~string((string *)&local_108);
      this_local._7_1_ = false;
    }
  }
  else {
    std::operator+(&local_90,"multiple generators registered under: -",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   code_generator_local);
    Error(this,&local_90,false,false);
    std::__cxx11::string::~string((string *)&local_90);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FlatCompiler::RegisterCodeGenerator(
    const FlatCOption &option, std::shared_ptr<CodeGenerator> code_generator) {
  if (!option.short_opt.empty() &&
      code_generators_.find("-" + option.short_opt) != code_generators_.end()) {
    Error("multiple generators registered under: -" + option.short_opt, false,
          false);
    return false;
  }

  if (!option.short_opt.empty()) {
    code_generators_["-" + option.short_opt] = code_generator;
  }

  if (!option.long_opt.empty() &&
      code_generators_.find("--" + option.long_opt) != code_generators_.end()) {
    Error("multiple generators registered under: --" + option.long_opt, false,
          false);
    return false;
  }

  if (!option.long_opt.empty()) {
    code_generators_["--" + option.long_opt] = code_generator;
  }

  language_options.insert(option);

  return true;
}